

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

char * cimg_library::cimg::medcon_path(char *user_path,bool reinit_path)

{
  char *pcVar1;
  FILE *__stream;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,reinit_path) != 0) {
    if (medcon_path::st_path != (char *)0x0) {
      operator_delete__(medcon_path::st_path);
    }
    medcon_path::st_path = (char *)0x0;
  }
  if (user_path == (char *)0x0) {
    if (medcon_path::st_path == (char *)0x0) {
      pcVar1 = (char *)operator_new__(0x400);
      medcon_path::st_path = pcVar1;
      memset(pcVar1 + 9,0,0x3f7);
      builtin_strncpy(pcVar1,"./medcon",9);
      __stream = ::fopen(pcVar1,"r");
      if (__stream == (FILE *)0x0) {
        builtin_strncpy(medcon_path::st_path,"medcon",7);
      }
      else {
        fclose(__stream);
      }
    }
  }
  else {
    if (medcon_path::st_path == (char *)0x0) {
      medcon_path::st_path = (char *)operator_new__(0x400);
    }
    pcVar1 = medcon_path::st_path;
    memset(medcon_path::st_path,0,0x400);
    strncpy(pcVar1,user_path,0x3ff);
  }
  return medcon_path::st_path;
}

Assistant:

inline const char* medcon_path(const char *const user_path=0, const bool reinit_path=false) {
      static char *st_path = 0;
      if (reinit_path) { delete[] st_path; st_path = 0; }
      if (user_path) {
        if (!st_path) st_path = new char[1024];
        std::memset(st_path,0,1024);
        std::strncpy(st_path,user_path,1023);
      } else if (!st_path) {
        st_path = new char[1024];
        std::memset(st_path,0,1024);
        bool path_found = false;
        std::FILE *file = 0;
#if cimg_OS==2
        const char *const pf_path = programfiles_path();
        if (!path_found) {
          std::strcpy(st_path,".\\medcon.exe");
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) {
          cimg_snprintf(st_path,sizeof(st_path),"%s\\XMedCon\\bin\\medcon.bat",pf_path);
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) {
          cimg_snprintf(st_path,sizeof(st_path),"%s\\XMedCon\\bin\\medcon.exe",pf_path);
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(st_path,"medcon.exe");
#else
        if (!path_found) {
          std::strcpy(st_path,"./medcon");
          if ((file=std::fopen(st_path,"r"))!=0) { cimg::fclose(file); path_found = true; }
        }
        if (!path_found) std::strcpy(st_path,"medcon");
#endif
        winformat_string(st_path);
      }
      return st_path;
    }